

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_end(uchar *hval,sha256_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  __uint32_t _Var3;
  uint uVar4;
  sha256_ctx *in_RSI;
  long in_RDI;
  int _i;
  sha2_32t i;
  uint local_18;
  uint local_14;
  
  uVar1 = in_RSI->count[0];
  uVar2 = uVar1 & 0x3f;
  local_18 = uVar2 + 3 >> 2;
  while (uVar4 = local_18 - 1, local_18 != 0) {
    _Var3 = __bswap_32(in_RSI->wbuf[(int)uVar4]);
    in_RSI->wbuf[(int)uVar4] = _Var3;
    local_18 = uVar4;
  }
  in_RSI->wbuf[uVar2 >> 2] = in_RSI->wbuf[uVar2 >> 2] & m1[uVar1 & 3] | b1[uVar1 & 3];
  if (uVar2 < 0x38) {
    local_14 = (uVar2 >> 2) + 1;
  }
  else {
    if (uVar2 < 0x3c) {
      in_RSI->wbuf[0xf] = 0;
    }
    sha256_compile(in_RSI);
    local_14 = 0;
  }
  while (local_14 < 0xe) {
    in_RSI->wbuf[local_14] = 0;
    local_14 = local_14 + 1;
  }
  in_RSI->wbuf[0xe] = in_RSI->count[1] << 3 | in_RSI->count[0] >> 0x1d;
  in_RSI->wbuf[0xf] = in_RSI->count[0] << 3;
  sha256_compile(in_RSI);
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    *(char *)(in_RDI + (ulong)local_14) =
         (char)(in_RSI->hash[local_14 >> 2] >> (sbyte)(((local_14 ^ 0xffffffff) & 3) << 3));
  }
  return;
}

Assistant:

void sha256_end(unsigned char hval[], sha256_ctx ctx[1])
{   sha2_32t    i = (sha2_32t)(ctx->count[0] & SHA256_MASK);

        bsw_32(ctx->wbuf, (i + 3) >> 2)
    /* bytes in the buffer are now in an order in which references  */
    /* to 32-bit words will put bytes with lower addresses into the */
    /* top of 32 bit words on BOTH big and little endian machines   */
    
    /* we now need to mask valid bytes and add the padding which is */
    /* a single 1 bit and as many zero bits as necessary.           */
    ctx->wbuf[i >> 2] = (ctx->wbuf[i >> 2] & m1[i & 3]) | b1[i & 3];

    /* we need 9 or more empty positions, one for the padding byte  */
    /* (above) and eight for the length count.  If there is not     */
    /* enough space pad and empty the buffer                        */
    if(i > SHA256_BLOCK_SIZE - 9)
    {
        if(i < 60) ctx->wbuf[15] = 0;
        sha256_compile(ctx);
        i = 0;
    }
    else    /* compute a word index for the empty buffer positions  */
        i = (i >> 2) + 1;

    while(i < 14) /* and zero pad all but last two positions      */ 
        ctx->wbuf[i++] = 0;
    
    /* the following 32-bit length fields are assembled in the      */
    /* wrong byte order on little endian machines but this is       */
    /* corrected later since they are only ever used as 32-bit      */
    /* word values.                                                 */

    ctx->wbuf[14] = (ctx->count[1] << 3) | (ctx->count[0] >> 29);
    ctx->wbuf[15] = ctx->count[0] << 3;

    sha256_compile(ctx);

    /* extract the hash value as bytes in case the hash buffer is   */
    /* mislaigned for 32-bit words                                  */
    for(i = 0; i < SHA256_DIGEST_SIZE; ++i)
        hval[i] = (unsigned char)(ctx->hash[i >> 2] >> 8 * (~i & 3));
}